

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lax_der_privatekey_parsing.c
# Opt level: O3

int ec_privkey_export_der
              (secp256k1_context *ctx,uchar *privkey,size_t *privkeylen,uchar *key32,int compressed)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  uint flags;
  long lVar5;
  uchar *output;
  secp256k1_pubkey pubkey;
  size_t local_78;
  secp256k1_pubkey local_70;
  
  iVar4 = secp256k1_ec_pubkey_create(ctx,&local_70,key32);
  if (iVar4 == 0) {
    local_78 = 0;
    iVar4 = 0;
  }
  else {
    if (compressed == 0) {
      privkey[0] = '0';
      privkey[1] = 0x82;
      privkey[2] = '\x01';
      privkey[3] = '\x13';
      privkey[4] = '\x02';
      privkey[5] = '\x01';
      privkey[6] = '\x01';
      privkey[7] = '\x04';
      privkey[8] = ' ';
      uVar1 = *(undefined8 *)(key32 + 8);
      uVar2 = *(undefined8 *)(key32 + 0x10);
      uVar3 = *(undefined8 *)(key32 + 0x18);
      *(undefined8 *)(privkey + 9) = *(undefined8 *)key32;
      *(undefined8 *)(privkey + 0x11) = uVar1;
      *(undefined8 *)(privkey + 0x19) = uVar2;
      *(undefined8 *)(privkey + 0x21) = uVar3;
      memcpy(privkey + 0x29,ec_privkey_export_der::middle_1,0xad);
      lVar5 = 0xd6;
      output = privkey + 0xd6;
      local_78 = 0x41;
      flags = 2;
    }
    else {
      privkey[0] = '0';
      privkey[1] = 0x81;
      privkey[2] = 0xd3;
      privkey[3] = '\x02';
      privkey[4] = '\x01';
      privkey[5] = '\x01';
      privkey[6] = '\x04';
      privkey[7] = ' ';
      uVar1 = *(undefined8 *)(key32 + 8);
      uVar2 = *(undefined8 *)(key32 + 0x10);
      uVar3 = *(undefined8 *)(key32 + 0x18);
      *(undefined8 *)(privkey + 8) = *(undefined8 *)key32;
      *(undefined8 *)(privkey + 0x10) = uVar1;
      *(undefined8 *)(privkey + 0x18) = uVar2;
      *(undefined8 *)(privkey + 0x20) = uVar3;
      memcpy(privkey + 0x28,ec_privkey_export_der::middle,0x8d);
      lVar5 = 0xb5;
      output = privkey + 0xb5;
      local_78 = 0x21;
      flags = 0x102;
    }
    secp256k1_ec_pubkey_serialize(ctx,output,&local_78,&local_70,flags);
    local_78 = lVar5 + local_78;
    iVar4 = 1;
  }
  *privkeylen = local_78;
  return iVar4;
}

Assistant:

int ec_privkey_export_der(const secp256k1_context *ctx, unsigned char *privkey, size_t *privkeylen, const unsigned char *key32, int compressed) {
    secp256k1_pubkey pubkey;
    size_t pubkeylen = 0;
    if (!secp256k1_ec_pubkey_create(ctx, &pubkey, key32)) {
        *privkeylen = 0;
        return 0;
    }
    if (compressed) {
        static const unsigned char begin[] = {
            0x30,0x81,0xD3,0x02,0x01,0x01,0x04,0x20
        };
        static const unsigned char middle[] = {
            0xA0,0x81,0x85,0x30,0x81,0x82,0x02,0x01,0x01,0x30,0x2C,0x06,0x07,0x2A,0x86,0x48,
            0xCE,0x3D,0x01,0x01,0x02,0x21,0x00,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFE,0xFF,0xFF,0xFC,0x2F,0x30,0x06,0x04,0x01,0x00,0x04,0x01,0x07,0x04,
            0x21,0x02,0x79,0xBE,0x66,0x7E,0xF9,0xDC,0xBB,0xAC,0x55,0xA0,0x62,0x95,0xCE,0x87,
            0x0B,0x07,0x02,0x9B,0xFC,0xDB,0x2D,0xCE,0x28,0xD9,0x59,0xF2,0x81,0x5B,0x16,0xF8,
            0x17,0x98,0x02,0x21,0x00,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFE,0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,0xBF,0xD2,0x5E,
            0x8C,0xD0,0x36,0x41,0x41,0x02,0x01,0x01,0xA1,0x24,0x03,0x22,0x00
        };
        unsigned char *ptr = privkey;
        memcpy(ptr, begin, sizeof(begin)); ptr += sizeof(begin);
        memcpy(ptr, key32, 32); ptr += 32;
        memcpy(ptr, middle, sizeof(middle)); ptr += sizeof(middle);
        pubkeylen = 33;
        secp256k1_ec_pubkey_serialize(ctx, ptr, &pubkeylen, &pubkey, SECP256K1_EC_COMPRESSED);
        ptr += pubkeylen;
        *privkeylen = ptr - privkey;
    } else {
        static const unsigned char begin[] = {
            0x30,0x82,0x01,0x13,0x02,0x01,0x01,0x04,0x20
        };
        static const unsigned char middle[] = {
            0xA0,0x81,0xA5,0x30,0x81,0xA2,0x02,0x01,0x01,0x30,0x2C,0x06,0x07,0x2A,0x86,0x48,
            0xCE,0x3D,0x01,0x01,0x02,0x21,0x00,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFE,0xFF,0xFF,0xFC,0x2F,0x30,0x06,0x04,0x01,0x00,0x04,0x01,0x07,0x04,
            0x41,0x04,0x79,0xBE,0x66,0x7E,0xF9,0xDC,0xBB,0xAC,0x55,0xA0,0x62,0x95,0xCE,0x87,
            0x0B,0x07,0x02,0x9B,0xFC,0xDB,0x2D,0xCE,0x28,0xD9,0x59,0xF2,0x81,0x5B,0x16,0xF8,
            0x17,0x98,0x48,0x3A,0xDA,0x77,0x26,0xA3,0xC4,0x65,0x5D,0xA4,0xFB,0xFC,0x0E,0x11,
            0x08,0xA8,0xFD,0x17,0xB4,0x48,0xA6,0x85,0x54,0x19,0x9C,0x47,0xD0,0x8F,0xFB,0x10,
            0xD4,0xB8,0x02,0x21,0x00,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFE,0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,0xBF,0xD2,0x5E,
            0x8C,0xD0,0x36,0x41,0x41,0x02,0x01,0x01,0xA1,0x44,0x03,0x42,0x00
        };
        unsigned char *ptr = privkey;
        memcpy(ptr, begin, sizeof(begin)); ptr += sizeof(begin);
        memcpy(ptr, key32, 32); ptr += 32;
        memcpy(ptr, middle, sizeof(middle)); ptr += sizeof(middle);
        pubkeylen = 65;
        secp256k1_ec_pubkey_serialize(ctx, ptr, &pubkeylen, &pubkey, SECP256K1_EC_UNCOMPRESSED);
        ptr += pubkeylen;
        *privkeylen = ptr - privkey;
    }
    return 1;
}